

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>
                    *this,Index target,Index source)

{
  bool bVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pIVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pIVar8;
  long lVar9;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>
  *targetColumn;
  ulong uVar10;
  anon_class_1_0_00000001 local_44;
  anon_class_1_0_00000001 local_43;
  anon_class_1_0_00000001 local_42;
  anon_class_1_0_00000001 local_41;
  ulong local_40;
  anon_class_8_1_e4bd5e45 local_38;
  
  bVar1 = (this->reducedMatrixR_).
          super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
          .rowSwapped_;
  if (bVar1 == true) {
    if ((this->reducedMatrixR_).nextInsertIndex_ != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        pIVar8 = (this->reducedMatrixR_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(this->reducedMatrixR_).matrix_.
                       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8 >> 3) *
                0x6db6db6db6db6db7;
        if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_001aeb73;
        Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
        ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
                    *)((long)&(pIVar8->super_Row_access_option).columnIndex_ + lVar9),
                   &(this->reducedMatrixR_).
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                    .rowToIndex_,(Index)uVar10);
        uVar10 = uVar10 + 1;
        uVar2 = (this->reducedMatrixR_).nextInsertIndex_;
        lVar9 = lVar9 + 0x38;
      } while (uVar10 < uVar2);
      if (uVar2 != 0) {
        puVar3 = (this->reducedMatrixR_).
                 super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (this->reducedMatrixR_).
                 super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                 .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          puVar3[uVar6] = (uint)uVar6;
          puVar4[uVar6] = (uint)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar6 < (this->reducedMatrixR_).nextInsertIndex_);
      }
    }
    (this->reducedMatrixR_).
    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
    .rowSwapped_ = false;
    uVar6 = (ulong)target;
    pIVar8 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    targetColumn = pIVar8 + uVar6;
  }
  else {
    uVar6 = (ulong)target;
    pIVar8 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    targetColumn = pIVar8 + uVar6;
    if (bVar1 != false) {
      if ((this->reducedMatrixR_).nextInsertIndex_ != 0) {
        lVar9 = 0;
        uVar10 = 0;
        local_40 = uVar6;
        do {
          pIVar8 = (this->reducedMatrixR_).matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(this->reducedMatrixR_).matrix_.
                         super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8 >> 3) *
                  0x6db6db6db6db6db7;
          if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_001aeb73;
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
          ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
                      *)((long)&(pIVar8->super_Row_access_option).columnIndex_ + lVar9),
                     &(this->reducedMatrixR_).
                      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                      .rowToIndex_,(Index)uVar10);
          uVar10 = uVar10 + 1;
          uVar2 = (this->reducedMatrixR_).nextInsertIndex_;
          lVar9 = lVar9 + 0x38;
        } while (uVar10 < uVar2);
        uVar6 = local_40;
        if (uVar2 != 0) {
          puVar3 = (this->reducedMatrixR_).
                   super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar4 = (this->reducedMatrixR_).
                   super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                   .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = 0;
          do {
            puVar3[uVar10] = (uint)uVar10;
            puVar4[uVar10] = (uint)uVar10;
            uVar10 = uVar10 + 1;
          } while (uVar10 < (this->reducedMatrixR_).nextInsertIndex_);
        }
      }
      (this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
      .rowSwapped_ = false;
      pIVar8 = (this->reducedMatrixR_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  local_38.targetColumn = targetColumn;
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_mat___e_matrix::Column_types)7,true,false,false,false,true,true,true>>::Matrix_column_tag,1u>,false>___1_>
            (pIVar8 + source,targetColumn,&local_41,&local_38,&local_42,&local_43,&local_44);
  bVar1 = (this->mirrorMatrixU_).
          super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
          .rowSwapped_;
  if (bVar1 == true) {
    if ((this->mirrorMatrixU_).nextInsertIndex_ != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        pIVar8 = (this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(this->mirrorMatrixU_).matrix_.
                       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8 >> 3) *
                0x6db6db6db6db6db7;
        if (uVar7 < uVar10 || uVar7 - uVar10 == 0) {
LAB_001aeb73:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
        }
        Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
        ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
                    *)((long)&(pIVar8->super_Row_access_option).columnIndex_ + lVar9),
                   &(this->mirrorMatrixU_).
                    super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                    .rowToIndex_,(Index)uVar10);
        uVar10 = uVar10 + 1;
        uVar2 = (this->mirrorMatrixU_).nextInsertIndex_;
        lVar9 = lVar9 + 0x38;
      } while (uVar10 < uVar2);
      if (uVar2 != 0) {
        puVar3 = (this->mirrorMatrixU_).
                 super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (this->mirrorMatrixU_).
                 super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                 .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          puVar3[uVar10] = (uint)uVar10;
          puVar4[uVar10] = (uint)uVar10;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (this->mirrorMatrixU_).nextInsertIndex_);
      }
    }
    (this->mirrorMatrixU_).
    super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
    .rowSwapped_ = false;
    pIVar8 = (this->mirrorMatrixU_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar5 = pIVar8;
  }
  else {
    pIVar8 = (this->mirrorMatrixU_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar5 = pIVar8;
    if (bVar1 != false) {
      if ((this->mirrorMatrixU_).nextInsertIndex_ != 0) {
        lVar9 = 0;
        uVar10 = 0;
        local_40 = uVar6;
        do {
          pIVar5 = (this->mirrorMatrixU_).matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(this->mirrorMatrixU_).matrix_.
                         super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5 >> 3) *
                  0x6db6db6db6db6db7;
          if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_001aeb73;
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
          ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,true,true>>>
                      *)((long)&(pIVar5->super_Row_access_option).columnIndex_ + lVar9),
                     &(this->mirrorMatrixU_).
                      super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                      .rowToIndex_,(Index)uVar10);
          uVar10 = uVar10 + 1;
          uVar2 = (this->mirrorMatrixU_).nextInsertIndex_;
          lVar9 = lVar9 + 0x38;
        } while (uVar10 < uVar2);
        uVar6 = local_40;
        if (uVar2 != 0) {
          puVar3 = (this->mirrorMatrixU_).
                   super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar4 = (this->mirrorMatrixU_).
                   super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
                   .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = 0;
          do {
            puVar3[uVar10] = (uint)uVar10;
            puVar4[uVar10] = (uint)uVar10;
            uVar10 = uVar10 + 1;
          } while (uVar10 < (this->mirrorMatrixU_).nextInsertIndex_);
        }
      }
      (this->mirrorMatrixU_).
      super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>
      .rowSwapped_ = false;
      pIVar5 = (this->mirrorMatrixU_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_true,_true>_>_>
  ::push_back(pIVar8 + source,(Entry *)(*(long *)&pIVar5[uVar6].column_.super_type.data_ + -8));
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}